

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_rate_adapted_fer.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  unsigned_long num_frames_to_test;
  unsigned_long quit_at_n_errors;
  unsigned_long max_num_iter;
  pointer pcVar2;
  unsigned_long update_console_every_n_frames;
  ostream *poVar3;
  long lVar4;
  string *generalProgramDescriptionForHelpText;
  pointer pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pair<unsigned_long,_unsigned_long> pVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rate_adaption_file_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> code_file_path;
  Parser parser;
  RateAdaptiveCode<unsigned_int> H;
  mt19937_64 rng;
  char local_b51;
  double local_b50;
  unsigned_long local_b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  string local_b00;
  Parser local_ae0;
  RateAdaptiveCode<unsigned_int> local_a70;
  undefined1 local_9f8 [2496];
  size_t local_38;
  
  generalProgramDescriptionForHelpText = &local_b00;
  local_b00._M_dataplus._M_p = (pointer)&local_b00.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)generalProgramDescriptionForHelpText,
             "Frame Error Rate (FER) Simulator for Rate Adapted LDPC Codes\n\nThis software is used to \n- load an LDPC code (from a .cscmat or bincsc.json file storing the full binary LDPC matrix in compressed sparse column (CSC) format, no QC exponents allowed!)\n- load rate adaption (from a csv file, list of pairs of row indices combined at each rate adaption step)    (this is optional; without rate adaption, only FER of the LDPC code can be simulated)\n- Simulate the FER of the given LDPC code at specified amount of rate adaption."
             ,"");
  cli::Parser::Parser(&local_ae0,argc,argv,generalProgramDescriptionForHelpText);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b00._M_dataplus._M_p != &local_b00.field_2) {
    operator_delete(local_b00._M_dataplus._M_p,local_b00.field_2._M_allocated_capacity + 1);
  }
  configure_parser(&local_ae0);
  bVar1 = cli::Parser::run(&local_ae0,(ostream *)&std::cout,(ostream *)&std::cerr);
  if (bVar1) {
    pcVar5 = local_9f8 + 0x10;
    local_9f8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"p","");
    local_b50 = cli::Parser::get<double>(&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar5) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"mf","");
    num_frames_to_test = cli::Parser::get<unsigned_long>(&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar5) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"me","");
    quit_at_n_errors = cli::Parser::get<unsigned_long>(&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar5) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"i","");
    max_num_iter = cli::Parser::get<unsigned_long>(&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar5) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"s","");
    pcVar2 = (pointer)cli::Parser::get<unsigned_long>(&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar5) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"upn","");
    update_console_every_n_frames = cli::Parser::get<unsigned_long>(&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar5) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"cp","");
    cli::Parser::get<std::__cxx11::string>(&local_b20,&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar5) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"rp","");
    cli::Parser::get<std::__cxx11::string>(&local_b40,&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar5) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    local_9f8._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"rn","");
    local_b48 = cli::Parser::get<unsigned_long>(&local_ae0,(string *)local_9f8);
    if ((pointer)local_9f8._0_8_ != pcVar5) {
      operator_delete((void *)local_9f8._0_8_,local_9f8._16_8_ + 1);
    }
    LDPC4QKD::CodeSimulationHelpers::load_ldpc<bool,unsigned_int,unsigned_int>
              (&local_a70,(CodeSimulationHelpers *)&local_b20,&local_b40,
               generalProgramDescriptionForHelpText);
    LDPC4QKD::RateAdaptiveCode<unsigned_int>::recompute_pos_vn_cn(&local_a70,local_b48);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Code path: \'",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_b20._M_dataplus._M_p,local_b20._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Rate adaption path: \'",0x15);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_b40._M_dataplus._M_p,local_b40._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Running FER decoding test on channel parameter p : ",0x33);
    poVar3 = std::ostream::_M_insert<double>(local_b50);
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Max number of BP decoder iterations: ",0x25);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)max_num_iter);
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Max number of frames to simulate: ",0x22);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Quit at n frame errors: ",0x18);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"PRNG seed: ",0xb);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Update console every n frames: ",0x1f);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Code size before rate adaption: ",0x20);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," x ",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    local_9f8[0] = (string)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_9f8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Code size after rate adaption (if applicable): ",0x2f);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," x ",3);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\n",2);
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar4 = 1;
    pcVar5 = pcVar2;
    do {
      pcVar5 = (pointer)(((ulong)pcVar5 >> 0x3e ^ (ulong)pcVar5) * 0x5851f42d4c957f2d + lVar4);
      *(pointer *)(local_9f8 + lVar4 * 8) = pcVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x138);
    local_38 = 0x138;
    local_9f8._0_8_ = pcVar2;
    std::chrono::_V2::steady_clock::now();
    pVar8 = run_simulation<unsigned_int>
                      (&local_a70,local_b50,num_frames_to_test,(mt19937_64 *)local_9f8,max_num_iter,
                       update_console_every_n_frames,quit_at_n_errors);
    std::chrono::_V2::steady_clock::now();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n\nDONE! Simulation time: ",0x19);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds.",9);
    local_b51 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_b51,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Recorded ",9);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," frame errors out of ",0x15);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," (FER~",6);
    auVar6._8_4_ = pVar8.first._4_4_;
    auVar6._0_8_ = pVar8.first;
    auVar6._12_4_ = 0x45300000;
    auVar7._8_4_ = pVar8.second._4_4_;
    auVar7._0_8_ = pVar8.second;
    auVar7._12_4_ = 0x45300000;
    poVar3 = std::ostream::_M_insert<double>
                       (((auVar6._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)pVar8.first) - 4503599627370496.0)) /
                        ((auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)pVar8.second) - 4503599627370496.0)));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")...",4);
    std::endl<char,std::char_traits<char>>(poVar3);
    exit(0);
  }
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
    // parse command line arguments
    cli::Parser parser(argc, argv, help_text);
    configure_parser(parser);
    parser.run_and_exit_if_error();

    auto p = parser.get<double>("p");
    auto max_num_frames_to_test = parser.get<std::size_t>("mf");
    auto quit_at_n_errors = parser.get<std::size_t>("me");
    auto max_bp_iter = parser.get<std::size_t>("i");
    auto rng_seed = parser.get<std::size_t>("s");
    auto update_console_every_n_frames = parser.get<std::size_t>("upn");
    auto code_file_path = parser.get<std::string>("cp");
    auto rate_adaption_file_path = parser.get<std::string>("rp");
    auto n_line_combs = parser.get<std::size_t>("rn");

    // create LDPC code, with rate adaption if specified.
    auto H = load_ldpc(code_file_path, rate_adaption_file_path);
    // set rate adaption. Only works if rate adaption was specified!
    H.set_rate(n_line_combs);

    // print received arguments (simulation parameters)
    std::cout << std::endl;
    std::cout << "Code path: '" << code_file_path << "'\n";
    std::cout << "Rate adaption path: '" << rate_adaption_file_path << "'\n";
    std::cout << "Running FER decoding test on channel parameter p : " << p << '\n';
    std::cout << "Max number of BP decoder iterations: " << static_cast<int>(max_bp_iter) << '\n';
    std::cout << "Max number of frames to simulate: " << max_num_frames_to_test << '\n';
    std::cout << "Quit at n frame errors: " << quit_at_n_errors << '\n';
    std::cout << "PRNG seed: " << rng_seed << '\n';
    std::cout << "Update console every n frames: " << update_console_every_n_frames << '\n';
    std::cout << "Code size before rate adaption: " << H.get_n_rows_mother_matrix() << " x " << H.getNCols() << '\n';
    std::cout << "Code size after rate adaption (if applicable): "
              << H.get_n_rows_after_rate_adaption() << " x " << H.getNCols() << "\n\n" << std::endl;

    std::mt19937_64 rng(rng_seed);
    auto begin = std::chrono::steady_clock::now();

    // perform frame error rate simulation.
    std::pair<std::size_t, std::size_t> result = run_simulation(H, p, max_num_frames_to_test, rng,
                                                                max_bp_iter,
                                                                update_console_every_n_frames, quit_at_n_errors);
    std::size_t num_frame_errors = result.first;
    std::size_t num_frames_tested = result.second;
    double naive_fer = static_cast<double>(num_frame_errors) / static_cast<double>(num_frames_tested);

    auto now = std::chrono::steady_clock::now();
    std::cout << "\n\nDONE! Simulation time: " <<
              std::chrono::duration_cast<std::chrono::seconds>(now - begin).count() << " seconds." << '\n';

    std::cout << "Recorded " << num_frame_errors << " frame errors out of " << num_frames_tested
              << " (FER~" << naive_fer << ")..." << std::endl;

    exit(EXIT_SUCCESS);
}